

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O2

string * __thiscall Klex::parseOutWord_abi_cxx11_(string *__return_storage_ptr__,Klex *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while (this->charClass < SINGLE_QUOTE) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    nextChar(this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Klex::parseOutWord() {
    std::string lexeme;

    while(getCharClass() == CharClass::LETTER || getCharClass() == CharClass::DIGIT) {
        lexeme.push_back(getChar());
        nextChar();
    }

    return lexeme;
}